

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O1

REF_STATUS ref_histogram_node_tec(REF_GRID ref_grid,REF_DBL *observations)

{
  REF_NODE pRVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  REF_HISTOGRAM ref_histogram;
  REF_HISTOGRAM local_38;
  
  pRVar1 = ref_grid->node;
  uVar2 = ref_histogram_create(&local_38);
  if (uVar2 == 0) {
    uVar2 = ref_histogram_resolution(local_38,0x120,12.0);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x24b,"ref_histogram_node_tec",(ulong)uVar2,"res");
      return uVar2;
    }
    if (0 < pRVar1->max) {
      lVar5 = 0;
      do {
        if (((-1 < pRVar1->global[lVar5]) && (0.0 < observations[lVar5])) &&
           (uVar2 = ref_histogram_add(local_38,observations[lVar5]), uVar2 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x24f,"ref_histogram_node_tec",(ulong)uVar2,"add");
          return uVar2;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pRVar1->max);
    }
    uVar2 = ref_histogram_gather(local_38,ref_grid->mpi);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x252,"ref_histogram_node_tec",(ulong)uVar2,"gather");
      return uVar2;
    }
    if ((ref_grid->mpi->id == 0) && (uVar2 = ref_histogram_tec(local_38,"node"), uVar2 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x255,"ref_histogram_node_tec",(ulong)uVar2,"tec");
      return uVar2;
    }
    uVar2 = ref_histogram_free(local_38);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar4 = "free gram";
    uVar3 = 599;
  }
  else {
    pcVar4 = "create";
    uVar3 = 0x24a;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",uVar3
         ,"ref_histogram_node_tec",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_node_tec(REF_GRID ref_grid,
                                          REF_DBL *observations) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_HISTOGRAM ref_histogram;
  REF_INT node;

  RSS(ref_histogram_create(&ref_histogram), "create");
  RSS(ref_histogram_resolution(ref_histogram, 288, 12.0), "res");

  each_ref_node_valid_node(ref_node, node) {
    if (observations[node] > 0.0)
      RSS(ref_histogram_add(ref_histogram, observations[node]), "add");
  }

  RSS(ref_histogram_gather(ref_histogram, ref_grid_mpi(ref_grid)), "gather");

  if (ref_grid_once(ref_grid))
    RSS(ref_histogram_tec(ref_histogram, "node"), "tec");

  RSS(ref_histogram_free(ref_histogram), "free gram");
  return REF_SUCCESS;
}